

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O1

iterator __thiscall
first_fit_heap<32UL>::free_list_container::first_free
          (free_list_container *this,size_t size,iterator *before)

{
  iterator iVar1;
  bool bVar2;
  iterator iVar3;
  iterator __begin0;
  iterator local_40;
  iterator *local_38;
  
  local_40.block = this->list;
  if (local_40.block != (header_free *)0x0) {
    iVar3.block = (header_free *)0x0;
    local_38 = before;
    do {
      iVar1.block = local_40.block;
      bVar2 = fits(this,local_40.block,size);
      if (bVar2) {
        local_38->block = iVar3.block;
        return (iterator)iVar1.block;
      }
      iterator::operator++(&local_40);
      iVar3.block = iVar1.block;
    } while (local_40.block != (header_free *)0x0);
  }
  return (iterator)(header_free *)0x0;
}

Assistant:

iterator first_free(size_t size, iterator &before) const
        {
            iterator before_ = end();

            for (auto elem : *this) {
                if (fits(*elem, size)) {
                    before = before_;
                    return {elem};
                }
                before_ = iterator(elem);
            }

            return {};
        }